

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_decoder.c
# Opt level: O0

lzma_ret lzma_stream_decoder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,uint64_t memlimit,uint32_t flags
                   )

{
  lzma_next_coder *__dest;
  uint64_t local_90;
  undefined1 local_80 [8];
  undefined8 local_78;
  lzma_stream_coder *local_38;
  lzma_stream_coder *coder;
  uint64_t uStack_28;
  uint32_t flags_local;
  uint64_t memlimit_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  coder._4_4_ = flags;
  uStack_28 = memlimit;
  memlimit_local = (uint64_t)allocator;
  allocator_local = (lzma_allocator *)next;
  if ((code *)next->init != lzma_stream_decoder_init) {
    lzma_next_end(next,allocator);
  }
  allocator_local->opaque = lzma_stream_decoder_init;
  if ((coder._4_4_ & 0xffffffe0) == 0) {
    local_38 = (lzma_stream_coder *)allocator_local->alloc;
    if (local_38 == (lzma_stream_coder *)0x0) {
      local_38 = (lzma_stream_coder *)lzma_alloc(0x580,(lzma_allocator *)memlimit_local);
      if (local_38 == (lzma_stream_coder *)0x0) {
        return LZMA_MEM_ERROR;
      }
      allocator_local->alloc = (_func_void_ptr_void_ptr_size_t_size_t *)local_38;
      allocator_local[1].alloc = stream_decode;
      allocator_local[1].free = stream_decoder_end;
      allocator_local[2].alloc = stream_decoder_get_check;
      allocator_local[2].free = stream_decoder_memconfig;
      __dest = &local_38->block_decoder;
      memset(local_80,0,0x48);
      local_78 = 0xffffffffffffffff;
      memcpy(__dest,local_80,0x48);
      local_38->index_hash = (lzma_index_hash *)0x0;
    }
    if (uStack_28 == 0) {
      local_90 = 1;
    }
    else {
      local_90 = uStack_28;
    }
    local_38->memlimit = local_90;
    local_38->memusage = 0x8000;
    local_38->tell_no_check = (coder._4_4_ & 1) != 0;
    local_38->tell_unsupported_check = (coder._4_4_ & 2) != 0;
    local_38->tell_any_check = (coder._4_4_ & 4) != 0;
    local_38->ignore_check = (coder._4_4_ & 0x10) != 0;
    local_38->concatenated = (coder._4_4_ & 8) != 0;
    local_38->first_stream = true;
    next_local._4_4_ = stream_decoder_reset(local_38,(lzma_allocator *)memlimit_local);
  }
  else {
    next_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_stream_decoder_init(
		lzma_next_coder *next, const lzma_allocator *allocator,
		uint64_t memlimit, uint32_t flags)
{
	lzma_next_coder_init(&lzma_stream_decoder_init, next, allocator);

	if (flags & ~LZMA_SUPPORTED_FLAGS)
		return LZMA_OPTIONS_ERROR;

	lzma_stream_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_stream_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &stream_decode;
		next->end = &stream_decoder_end;
		next->get_check = &stream_decoder_get_check;
		next->memconfig = &stream_decoder_memconfig;

		coder->block_decoder = LZMA_NEXT_CODER_INIT;
		coder->index_hash = NULL;
	}

	coder->memlimit = my_max(1, memlimit);
	coder->memusage = LZMA_MEMUSAGE_BASE;
	coder->tell_no_check = (flags & LZMA_TELL_NO_CHECK) != 0;
	coder->tell_unsupported_check
			= (flags & LZMA_TELL_UNSUPPORTED_CHECK) != 0;
	coder->tell_any_check = (flags & LZMA_TELL_ANY_CHECK) != 0;
	coder->ignore_check = (flags & LZMA_IGNORE_CHECK) != 0;
	coder->concatenated = (flags & LZMA_CONCATENATED) != 0;
	coder->first_stream = true;

	return stream_decoder_reset(coder, allocator);
}